

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O0

void __thiscall despot::BaseRockSample::Init_5_5(BaseRockSample *this)

{
  ostream *this_00;
  int *piVar1;
  int local_48;
  int local_44;
  int i;
  Coord local_38 [8];
  Coord aCStack_30 [8];
  Coord aCStack_28 [8];
  Coord aCStack_20 [8];
  Coord aCStack_18 [8];
  BaseRockSample *local_10;
  BaseRockSample *this_local;
  
  local_10 = this;
  this_00 = std::operator<<((ostream *)&std::cout,"Using special layout for rocksample(5, 5)");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  despot::Coord::Coord(local_38,2,4);
  despot::Coord::Coord(aCStack_30,0,4);
  despot::Coord::Coord(aCStack_28,3,3);
  despot::Coord::Coord(aCStack_20,2,2);
  despot::Coord::Coord(aCStack_18,4,1);
  despot::Coord::Coord((Coord *)&i,0,2);
  *(undefined8 *)&this->start_pos_ = _i;
  local_44 = -1;
  Grid<int>::SetAllValues(&this->grid_,&local_44);
  for (local_48 = 0; local_48 < this->num_rocks_; local_48 = local_48 + 1) {
    piVar1 = Grid<int>::operator()(&this->grid_,local_38 + (long)local_48 * 8);
    *piVar1 = local_48;
    std::vector<despot::Coord,_std::allocator<despot::Coord>_>::push_back
              (&this->rock_pos_,local_38 + (long)local_48 * 8);
  }
  return;
}

Assistant:

void BaseRockSample::Init_5_5() {
	cout << "Using special layout for rocksample(5, 5)" << endl;

	Coord rocks[] = { Coord(2, 4), Coord(0, 4), Coord(3, 3), Coord(2, 2), Coord(
		4, 1) };

	start_pos_ = Coord(0, 2);
	grid_.SetAllValues(-1);
	for (int i = 0; i < num_rocks_; ++i) {
		grid_(rocks[i]) = i;
		rock_pos_.push_back(rocks[i]);
	}
}